

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O0

VTable * __thiscall
flatbuffers::BinaryAnnotator::GetOrBuildVTable
          (BinaryAnnotator *this,uint64_t vtable_offset,Object *table,
          uint64_t offset_of_referring_table)

{
  uint64_t uVar1;
  uint64_t length;
  Object *pOVar2;
  bool bVar3;
  mapped_type *this_00;
  BinaryAnnotator *pBVar4;
  String *this_01;
  unsigned_short *puVar5;
  Object *offset_00;
  mapped_type *pmVar6;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_short,_Entry>_>::value,_pair<iterator,_bool>_>
  _Var7;
  undefined1 local_ec8 [8];
  VTable vtable;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_e68;
  BinarySection local_e50;
  BinaryRegionComment local_e10;
  BinaryRegion local_d98;
  _Base_ptr local_cf8;
  undefined1 local_cf0;
  pair<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry> local_ce8;
  undefined1 local_cd0 [8];
  Entry entry;
  BinaryRegion local_c48;
  allocator<char> local_ba1;
  string local_ba0;
  uint64_t local_b80;
  uint64_t remaining_2;
  BinaryRegionComment field_comment;
  Optional<unsigned_short> offset_from_table;
  uint64_t field_offset;
  undefined1 auStack_ae8 [2];
  uint16_t id;
  uint16_t expectant_vtable_fields;
  Object **local_ae0;
  ushort *local_ad8;
  BinaryAnnotator *local_ad0;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *local_ac8;
  list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>
  **local_ac0;
  map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  *local_ab8;
  uint16_t *local_ab0;
  function<void_(const_reflection::Field_*)> local_aa8;
  uint16_t local_a82;
  undefined1 local_a80 [6];
  uint16_t fields_processed;
  map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  fields;
  uint64_t offset_start;
  BinaryRegion local_9d0;
  allocator<char> local_929;
  string local_928;
  allocator<char> local_901;
  string local_900;
  ushort local_8da;
  undefined1 local_8d8 [6];
  uint16_t table_size;
  BinaryRegion local_860;
  BinarySection local_7c0;
  allocator<char> local_779;
  string local_778;
  uint64_t local_758;
  uint64_t remaining_1;
  undefined1 local_748 [4];
  Optional<unsigned_short> table_length;
  BinaryRegionComment ref_table_len_comment;
  uint64_t offset;
  BinaryRegion local_650;
  undefined1 local_5b0 [8];
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  BinaryRegion local_520;
  BinarySection local_480;
  allocator<char> local_439;
  string local_438;
  BinaryRegionComment local_418;
  BinaryRegion local_3a0;
  BinarySection local_300;
  allocator<char> local_2b9;
  string local_2b8;
  ushort local_296 [3];
  undefined1 local_290 [2];
  uint16_t vtable_size;
  BinaryRegion local_218;
  BinarySection local_178;
  allocator<char> local_131;
  string local_130;
  uint64_t local_110;
  uint64_t remaining;
  _Optional_payload_base<unsigned_short> local_f4;
  undefined1 local_f0 [4];
  Optional<unsigned_short> vtable_length;
  BinaryRegionComment vtable_size_comment;
  string referring_table_name;
  VTable *vtable_1;
  iterator __end1;
  iterator __begin1;
  list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>
  *__range1;
  list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>
  *vtables;
  uint64_t offset_of_referring_table_local;
  Object *table_local;
  uint64_t vtable_offset_local;
  BinaryAnnotator *this_local;
  
  vtables = (list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>
             *)offset_of_referring_table;
  offset_of_referring_table_local = (uint64_t)table;
  table_local = (Object *)vtable_offset;
  vtable_offset_local = (uint64_t)this;
  this_00 = std::
            map<unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>_>_>_>
            ::operator[](&this->vtables_,(key_type *)&table_local);
  __end1 = std::__cxx11::
           list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>
           ::begin(this_00);
  vtable_1 = (VTable *)
             std::__cxx11::
             list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>
             ::end(this_00);
  while( true ) {
    bVar3 = std::operator!=(&__end1,(_Self *)&vtable_1);
    if (!bVar3) {
      bVar3 = std::__cxx11::
              list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>
              ::empty(this_00);
      if ((bVar3) && (bVar3 = ContainsSection(this,(uint64_t)table_local), bVar3)) {
        this_local = (BinaryAnnotator *)0x0;
      }
      else {
        this_01 = reflection::Object::name((Object *)offset_of_referring_table_local);
        String::str_abi_cxx11_((string *)&vtable_size_comment.index,this_01);
        BinaryRegionComment::BinaryRegionComment((BinaryRegionComment *)local_f0);
        vtable_size_comment.status_message.field_2._8_4_ = 5;
        local_f4 = (_Optional_payload_base<unsigned_short>)
                   ReadScalar<unsigned_short>(this,(uint64_t)table_local);
        bVar3 = std::optional<unsigned_short>::has_value((optional<unsigned_short> *)&local_f4);
        if (bVar3) {
          puVar5 = std::optional<unsigned_short>::value((optional<unsigned_short> *)&local_f4);
          local_296[0] = *puVar5;
          bVar3 = IsValidOffset(this,(uint64_t)(table_local + ((ulong)local_296[0] - 1)));
          if (bVar3) {
            if (local_296[0] < 4) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_438,"4",&local_439);
              anon_unknown_46::SetError
                        ((BinaryRegionComment *)local_f0,ERROR_LENGTH_TOO_SHORT,&local_438);
              std::__cxx11::string::~string((string *)&local_438);
              std::allocator<char>::~allocator(&local_439);
              pOVar2 = table_local;
              BinaryRegionComment::BinaryRegionComment
                        ((BinaryRegionComment *)
                         &regions.
                          super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (BinaryRegionComment *)local_f0);
              anon_unknown_46::MakeBinaryRegion
                        (&local_520,(uint64_t)pOVar2,2,Uint16,0,0,
                         (BinaryRegionComment *)
                         &regions.
                          super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              anon_unknown_46::MakeSingleRegionBinarySection
                        (&local_480,(string *)&vtable_size_comment.index,VTable,&local_520);
              AddSection(this,(uint64_t)pOVar2,&local_480);
              BinarySection::~BinarySection(&local_480);
              BinaryRegion::~BinaryRegion(&local_520);
              BinaryRegionComment::~BinaryRegionComment
                        ((BinaryRegionComment *)
                         &regions.
                          super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local = (BinaryAnnotator *)0x0;
              local_296[1] = 1;
              local_296[2] = 0;
            }
            else {
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              vector((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      *)local_5b0);
              pOVar2 = table_local;
              BinaryRegionComment::BinaryRegionComment
                        ((BinaryRegionComment *)&offset,(BinaryRegionComment *)local_f0);
              anon_unknown_46::MakeBinaryRegion
                        (&local_650,(uint64_t)pOVar2,2,Uint16,0,0,(BinaryRegionComment *)&offset);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                         *)local_5b0,&local_650);
              BinaryRegion::~BinaryRegion(&local_650);
              BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&offset);
              pOVar2 = table_local;
              offset_00 = table_local + 2;
              BinaryRegionComment::BinaryRegionComment((BinaryRegionComment *)local_748);
              remaining_1._4_4_ =
                   (_Optional_payload_base<unsigned_short>)
                   ReadScalar<unsigned_short>(this,(uint64_t)offset_00);
              bVar3 = std::optional<unsigned_short>::has_value
                                ((optional<unsigned_short> *)((long)&remaining_1 + 4));
              if (bVar3) {
                puVar5 = std::optional<unsigned_short>::value
                                   ((optional<unsigned_short> *)((long)&remaining_1 + 4));
                local_8da = *puVar5;
                bVar3 = IsValidOffset(this,(long)vtables + ((ulong)local_8da - 1));
                if (bVar3) {
                  if (local_8da < 4) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_928,"4",&local_929);
                    anon_unknown_46::SetError
                              ((BinaryRegionComment *)local_748,ERROR_LENGTH_TOO_SHORT,&local_928);
                    std::__cxx11::string::~string((string *)&local_928);
                    std::allocator<char>::~allocator(&local_929);
                  }
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_900,"",&local_901);
                  anon_unknown_46::SetError
                            ((BinaryRegionComment *)local_748,ERROR_LENGTH_TOO_LONG,&local_900);
                  std::__cxx11::string::~string((string *)&local_900);
                  std::allocator<char>::~allocator(&local_901);
                }
                BinaryRegionComment::BinaryRegionComment
                          ((BinaryRegionComment *)&offset_start,(BinaryRegionComment *)local_748);
                anon_unknown_46::MakeBinaryRegion
                          (&local_9d0,(uint64_t)offset_00,2,Uint16,0,0,
                           (BinaryRegionComment *)&offset_start);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           *)local_5b0,&local_9d0);
                BinaryRegion::~BinaryRegion(&local_9d0);
                BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&offset_start);
                fields._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)(pOVar2 + 4);
                std::
                map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                ::map((map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                       *)local_a80);
                uVar1 = offset_of_referring_table_local;
                local_a82 = 0;
                _auStack_ae8 = &fields._M_t._M_impl.super__Rb_tree_header._M_node_count;
                local_ae0 = &table_local;
                local_ad8 = local_296;
                local_ac8 = (vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                             *)local_5b0;
                local_ac0 = &vtables;
                local_ab0 = &local_a82;
                local_ad0 = this;
                local_ab8 = (map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                             *)local_a80;
                std::function<void(reflection::Field_const*)>::
                function<flatbuffers::BinaryAnnotator::GetOrBuildVTable(unsigned_long,reflection::Object_const*,unsigned_long)::__0,void>
                          ((function<void(reflection::Field_const*)> *)&local_aa8,
                           (anon_class_64_8_717743f0 *)auStack_ae8);
                ForAllFields((Object *)uVar1,false,&local_aa8);
                std::function<void_(const_reflection::Field_*)>::~function(&local_aa8);
                field_offset._6_2_ = (unsigned_short)(local_296[0] - 4 >> 1);
                field_offset._4_2_ = local_a82 * 3;
                puVar5 = std::min<unsigned_short>
                                   ((unsigned_short *)((long)&field_offset + 4),
                                    (unsigned_short *)((long)&field_offset + 6));
                field_offset._6_2_ = *puVar5;
                for (field_offset._2_2_ = local_a82; field_offset._2_2_ < field_offset._6_2_;
                    field_offset._2_2_ = field_offset._2_2_ + 1) {
                  uVar1 = fields._M_t._M_impl.super__Rb_tree_header._M_node_count +
                          (ulong)field_offset._2_2_ * 2;
                  field_comment.index._4_4_ =
                       (_Optional_payload_base<unsigned_short>)
                       ReadScalar<unsigned_short>(this,uVar1);
                  BinaryRegionComment::BinaryRegionComment((BinaryRegionComment *)&remaining_2);
                  field_comment.status_message.field_2._8_4_ = 8;
                  field_comment.default_value.field_2._8_8_ = ZEXT28(field_offset._2_2_);
                  bVar3 = std::optional<unsigned_short>::has_value
                                    ((optional<unsigned_short> *)((long)&field_comment.index + 4));
                  if (bVar3) {
                    VTable::Entry::Entry((Entry *)local_cd0);
                    local_cd0 = (undefined1  [8])0x0;
                    puVar5 = std::optional<unsigned_short>::value
                                       ((optional<unsigned_short> *)((long)&field_comment.index + 4)
                                       );
                    entry.field._0_2_ = *puVar5;
                    std::make_pair<unsigned_short&,flatbuffers::BinaryAnnotator::VTable::Entry&>
                              (&local_ce8,(unsigned_short *)((long)&field_offset + 2),
                               (Entry *)local_cd0);
                    _Var7 = std::
                            map<unsigned_short,flatbuffers::BinaryAnnotator::VTable::Entry,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,flatbuffers::BinaryAnnotator::VTable::Entry>>>
                            ::
                            insert<std::pair<unsigned_short,flatbuffers::BinaryAnnotator::VTable::Entry>>
                                      ((map<unsigned_short,flatbuffers::BinaryAnnotator::VTable::Entry,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,flatbuffers::BinaryAnnotator::VTable::Entry>>>
                                        *)local_a80,&local_ce8);
                    local_cf8 = (_Base_ptr)_Var7.first._M_node;
                    local_cf0 = _Var7.second;
                    BinaryRegionComment::BinaryRegionComment
                              (&local_e10,(BinaryRegionComment *)&remaining_2);
                    anon_unknown_46::MakeBinaryRegion(&local_d98,uVar1,2,VOffset,0,0,&local_e10);
                    std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               *)local_5b0,&local_d98);
                    BinaryRegion::~BinaryRegion(&local_d98);
                    BinaryRegionComment::~BinaryRegionComment(&local_e10);
                    local_296[1] = 0;
                    local_296[2] = 0;
                  }
                  else {
                    local_b80 = RemainingBytes(this,uVar1);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_ba0,"2",&local_ba1);
                    anon_unknown_46::SetError
                              ((BinaryRegionComment *)&remaining_2,ERROR_INCOMPLETE_BINARY,
                               &local_ba0);
                    std::__cxx11::string::~string((string *)&local_ba0);
                    std::allocator<char>::~allocator(&local_ba1);
                    length = local_b80;
                    BinaryRegionComment::BinaryRegionComment
                              ((BinaryRegionComment *)&entry.offset_from_table,
                               (BinaryRegionComment *)&remaining_2);
                    anon_unknown_46::MakeBinaryRegion
                              (&local_c48,uVar1,length,Unknown,length,0,
                               (BinaryRegionComment *)&entry.offset_from_table);
                    std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               *)local_5b0,&local_c48);
                    BinaryRegion::~BinaryRegion(&local_c48);
                    BinaryRegionComment::~BinaryRegionComment
                              ((BinaryRegionComment *)&entry.offset_from_table);
                    local_296[1] = 6;
                    local_296[2] = 0;
                  }
                  BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&remaining_2);
                }
                bVar3 = std::__cxx11::
                        list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>
                        ::empty(this_00);
                if (bVar3) {
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::vector(&local_e68,
                           (vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            *)local_5b0);
                  anon_unknown_46::MakeBinarySection
                            (&local_e50,(string *)&vtable_size_comment.index,VTable,&local_e68);
                  pmVar6 = std::
                           map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
                           ::operator[](&this->sections_,(key_type *)&table_local);
                  BinarySection::operator=(pmVar6,&local_e50);
                  BinarySection::~BinarySection(&local_e50);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::~vector(&local_e68);
                }
                else {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vtable.vtable_size,", ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vtable_size_comment.index);
                  pmVar6 = std::
                           map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
                           ::operator[](&this->sections_,(key_type *)&table_local);
                  std::__cxx11::string::operator+=((string *)pmVar6,(string *)&vtable.vtable_size);
                  std::__cxx11::string::~string((string *)&vtable.vtable_size);
                }
                VTable::VTable((VTable *)local_ec8);
                local_ec8 = (undefined1  [8])offset_of_referring_table_local;
                std::
                map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                ::operator=((map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                             *)&vtable,
                            (map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                             *)local_a80);
                vtable.fields._M_t._M_impl.super__Rb_tree_header._M_node_count._2_2_ = local_8da;
                vtable.fields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_2_ = local_296[0];
                std::__cxx11::
                list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>
                ::push_back(this_00,(VTable *)local_ec8);
                this_local = (BinaryAnnotator *)
                             std::__cxx11::
                             list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>
                             ::back(this_00);
                local_296[1] = 1;
                local_296[2] = 0;
                VTable::~VTable((VTable *)local_ec8);
                std::
                map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                ::~map((map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                        *)local_a80);
              }
              else {
                local_758 = RemainingBytes(this,(uint64_t)offset_00);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_778,"2",&local_779);
                anon_unknown_46::SetError
                          ((BinaryRegionComment *)local_748,ERROR_INCOMPLETE_BINARY,&local_778);
                std::__cxx11::string::~string((string *)&local_778);
                std::allocator<char>::~allocator(&local_779);
                uVar1 = local_758;
                BinaryRegionComment::BinaryRegionComment
                          ((BinaryRegionComment *)local_8d8,(BinaryRegionComment *)local_748);
                anon_unknown_46::MakeBinaryRegion
                          (&local_860,(uint64_t)offset_00,uVar1,Unknown,uVar1,0,
                           (BinaryRegionComment *)local_8d8);
                anon_unknown_46::MakeSingleRegionBinarySection
                          (&local_7c0,(string *)&vtable_size_comment.index,VTable,&local_860);
                AddSection(this,(uint64_t)offset_00,&local_7c0);
                BinarySection::~BinarySection(&local_7c0);
                BinaryRegion::~BinaryRegion(&local_860);
                BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_8d8);
                this_local = (BinaryAnnotator *)0x0;
                local_296[1] = 1;
                local_296[2] = 0;
              }
              BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_748);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              ~vector((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       *)local_5b0);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"",&local_2b9);
            anon_unknown_46::SetError
                      ((BinaryRegionComment *)local_f0,ERROR_LENGTH_TOO_LONG,&local_2b8);
            std::__cxx11::string::~string((string *)&local_2b8);
            std::allocator<char>::~allocator(&local_2b9);
            pOVar2 = table_local;
            BinaryRegionComment::BinaryRegionComment(&local_418,(BinaryRegionComment *)local_f0);
            anon_unknown_46::MakeBinaryRegion(&local_3a0,(uint64_t)pOVar2,2,Uint16,0,0,&local_418);
            anon_unknown_46::MakeSingleRegionBinarySection
                      (&local_300,(string *)&vtable_size_comment.index,VTable,&local_3a0);
            AddSection(this,(uint64_t)pOVar2,&local_300);
            BinarySection::~BinarySection(&local_300);
            BinaryRegion::~BinaryRegion(&local_3a0);
            BinaryRegionComment::~BinaryRegionComment(&local_418);
            this_local = (BinaryAnnotator *)0x0;
            local_296[1] = 1;
            local_296[2] = 0;
          }
        }
        else {
          local_110 = RemainingBytes(this,(uint64_t)table_local);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"2",&local_131);
          anon_unknown_46::SetError
                    ((BinaryRegionComment *)local_f0,ERROR_INCOMPLETE_BINARY,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::allocator<char>::~allocator(&local_131);
          pOVar2 = table_local;
          uVar1 = local_110;
          BinaryRegionComment::BinaryRegionComment
                    ((BinaryRegionComment *)local_290,(BinaryRegionComment *)local_f0);
          anon_unknown_46::MakeBinaryRegion
                    (&local_218,(uint64_t)pOVar2,uVar1,Unknown,uVar1,0,
                     (BinaryRegionComment *)local_290);
          anon_unknown_46::MakeSingleRegionBinarySection
                    (&local_178,(string *)&vtable_size_comment.index,VTable,&local_218);
          AddSection(this,(uint64_t)pOVar2,&local_178);
          BinarySection::~BinarySection(&local_178);
          BinaryRegion::~BinaryRegion(&local_218);
          BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_290);
          this_local = (BinaryAnnotator *)0x0;
          local_296[1] = 1;
          local_296[2] = 0;
        }
        BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_f0);
        std::__cxx11::string::~string((string *)&vtable_size_comment.index);
      }
      return (VTable *)this_local;
    }
    pBVar4 = (BinaryAnnotator *)
             std::_List_iterator<flatbuffers::BinaryAnnotator::VTable>::operator*(&__end1);
    if ((Object *)pBVar4->bfbs_ == (Object *)offset_of_referring_table_local) break;
    std::_List_iterator<flatbuffers::BinaryAnnotator::VTable>::operator++(&__end1);
  }
  return (VTable *)pBVar4;
}

Assistant:

BinaryAnnotator::VTable *BinaryAnnotator::GetOrBuildVTable(
    const uint64_t vtable_offset, const reflection::Object *const table,
    const uint64_t offset_of_referring_table) {
  // Get a list of vtables (if any) already defined at this offset.
  std::list<VTable> &vtables = vtables_[vtable_offset];

  // See if this vtable for the table type has been generated before.
  for (VTable &vtable : vtables) {
    if (vtable.referring_table == table) { return &vtable; }
  }

  // If we are trying to make a new vtable and it is already encompassed by
  // another binary section, something is corrupted.
  if (vtables.empty() && ContainsSection(vtable_offset)) { return nullptr; }

  const std::string referring_table_name = table->name()->str();

  BinaryRegionComment vtable_size_comment;
  vtable_size_comment.type = BinaryRegionCommentType::VTableSize;

  const auto vtable_length = ReadScalar<uint16_t>(vtable_offset);
  if (!vtable_length.has_value()) {
    const uint64_t remaining = RemainingBytes(vtable_offset);

    SetError(vtable_size_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
             "2");

    AddSection(vtable_offset,
               MakeSingleRegionBinarySection(
                   referring_table_name, BinarySectionType::VTable,
                   MakeBinaryRegion(vtable_offset, remaining,
                                    BinaryRegionType::Unknown, remaining, 0,
                                    vtable_size_comment)));
    return nullptr;
  }

  // Vtables start with the size of the vtable
  const uint16_t vtable_size = vtable_length.value();

  if (!IsValidOffset(vtable_offset + vtable_size - 1)) {
    SetError(vtable_size_comment, BinaryRegionStatus::ERROR_LENGTH_TOO_LONG);
    // The vtable_size points to off the end of the binary.
    AddSection(vtable_offset,
               MakeSingleRegionBinarySection(
                   referring_table_name, BinarySectionType::VTable,
                   MakeBinaryRegion(vtable_offset, sizeof(uint16_t),
                                    BinaryRegionType::Uint16, 0, 0,
                                    vtable_size_comment)));

    return nullptr;
  } else if (vtable_size < 2 * sizeof(uint16_t)) {
    SetError(vtable_size_comment, BinaryRegionStatus::ERROR_LENGTH_TOO_SHORT,
             "4");
    // The size includes itself and the table size which are both uint16_t.
    AddSection(vtable_offset,
               MakeSingleRegionBinarySection(
                   referring_table_name, BinarySectionType::VTable,
                   MakeBinaryRegion(vtable_offset, sizeof(uint16_t),
                                    BinaryRegionType::Uint16, 0, 0,
                                    vtable_size_comment)));
    return nullptr;
  }

  std::vector<BinaryRegion> regions;

  regions.push_back(MakeBinaryRegion(vtable_offset, sizeof(uint16_t),
                                     BinaryRegionType::Uint16, 0, 0,
                                     vtable_size_comment));
  uint64_t offset = vtable_offset + sizeof(uint16_t);

  BinaryRegionComment ref_table_len_comment;
  ref_table_len_comment.type =
      BinaryRegionCommentType::VTableRefferingTableLength;

  // Ensure we can read the next uint16_t field, which is the size of the
  // referring table.
  const auto table_length = ReadScalar<uint16_t>(offset);

  if (!table_length.has_value()) {
    const uint64_t remaining = RemainingBytes(offset);
    SetError(ref_table_len_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
             "2");

    AddSection(offset, MakeSingleRegionBinarySection(
                           referring_table_name, BinarySectionType::VTable,
                           MakeBinaryRegion(
                               offset, remaining, BinaryRegionType::Unknown,
                               remaining, 0, ref_table_len_comment)));
    return nullptr;
  }

  // Then they have the size of the table they reference.
  const uint16_t table_size = table_length.value();

  if (!IsValidOffset(offset_of_referring_table + table_size - 1)) {
    SetError(ref_table_len_comment, BinaryRegionStatus::ERROR_LENGTH_TOO_LONG);
  } else if (table_size < 4) {
    SetError(ref_table_len_comment, BinaryRegionStatus::ERROR_LENGTH_TOO_SHORT,
             "4");
  }

  regions.push_back(MakeBinaryRegion(offset, sizeof(uint16_t),
                                     BinaryRegionType::Uint16, 0, 0,
                                     ref_table_len_comment));
  offset += sizeof(uint16_t);

  const uint64_t offset_start = offset;

  // A mapping between field (and its id) to the relative offset (uin16_t) from
  // the start of the table.
  std::map<uint16_t, VTable::Entry> fields;

  // Counter for determining if the binary has more vtable entries than the
  // schema provided. This can occur if the binary was created at a newer schema
  // version and is being processed with an older one.
  uint16_t fields_processed = 0;

  // Loop over all the fields.
  ForAllFields(table, /*reverse=*/false, [&](const reflection::Field *field) {
    const uint64_t field_offset = offset_start + field->id() * sizeof(uint16_t);

    if (field_offset >= vtable_offset + vtable_size) {
      // This field_offset is too large for this vtable, so it must come from a
      // newer schema than the binary was create with or the binary writer did
      // not write it. For either case, it is safe to ignore.

      // TODO(dbaileychess): We could show which fields are not set an their
      // default values if we want. We just need a way to make it obvious that
      // it isn't part of the buffer.
      return;
    }

    BinaryRegionComment field_comment;
    field_comment.type = BinaryRegionCommentType::VTableFieldOffset;
    field_comment.name = std::string(field->name()->c_str()) +
                         "` (id: " + std::to_string(field->id()) + ")";

    const auto offset_from_table = ReadScalar<uint16_t>(field_offset);

    if (!offset_from_table.has_value()) {
      const uint64_t remaining = RemainingBytes(field_offset);

      SetError(field_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "2");
      regions.push_back(MakeBinaryRegion(field_offset, remaining,
                                         BinaryRegionType::Unknown, remaining,
                                         0, field_comment));

      return;
    }

    if (!IsValidOffset(offset_of_referring_table + offset_from_table.value() -
                       1)) {
      SetError(field_comment, BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);
      regions.push_back(MakeBinaryRegion(field_offset, sizeof(uint16_t),
                                         BinaryRegionType::VOffset, 0, 0,
                                         field_comment));
      return;
    }

    VTable::Entry entry;
    entry.field = field;
    entry.offset_from_table = offset_from_table.value();
    fields.insert(std::make_pair(field->id(), entry));

    std::string default_label;
    if (offset_from_table.value() == 0) {
      // Not present, so could be default or be optional.
      if (field->required()) {
        SetError(field_comment,
                 BinaryRegionStatus::ERROR_REQUIRED_FIELD_NOT_PRESENT);
        // If this is a required field, make it known this is an error.
        regions.push_back(MakeBinaryRegion(field_offset, sizeof(uint16_t),
                                           BinaryRegionType::VOffset, 0, 0,
                                           field_comment));
        return;
      } else {
        // Its an optional field, so get the default value and interpret and
        // provided an annotation for it.
        if (IsScalar(field->type()->base_type())) {
          default_label += "<defaults to ";
          default_label += IsFloat(field->type()->base_type())
                               ? std::to_string(field->default_real())
                               : std::to_string(field->default_integer());
          default_label += "> (";
        } else {
          default_label += "<null> (";
        }
        default_label +=
            reflection::EnumNameBaseType(field->type()->base_type());
        default_label += ")";
      }
    }
    field_comment.default_value = default_label;

    regions.push_back(MakeBinaryRegion(field_offset, sizeof(uint16_t),
                                       BinaryRegionType::VOffset, 0, 0,
                                       field_comment));

    fields_processed++;
  });

  // Check if we covered all the expectant fields. If not, we need to add them
  // as unknown fields.
  uint16_t expectant_vtable_fields =
      (vtable_size - sizeof(uint16_t) - sizeof(uint16_t)) / sizeof(uint16_t);

  // Prevent a bad binary from declaring a really large vtable_size, that we can
  // not independently verify.
  expectant_vtable_fields = std::min(
      static_cast<uint16_t>(fields_processed * 3), expectant_vtable_fields);

  for (uint16_t id = fields_processed; id < expectant_vtable_fields; ++id) {
    const uint64_t field_offset = offset_start + id * sizeof(uint16_t);

    const auto offset_from_table = ReadScalar<uint16_t>(field_offset);

    BinaryRegionComment field_comment;
    field_comment.type = BinaryRegionCommentType::VTableUnknownFieldOffset;
    field_comment.index = id;

    if (!offset_from_table.has_value()) {
      const uint64_t remaining = RemainingBytes(field_offset);
      SetError(field_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "2");
      regions.push_back(MakeBinaryRegion(field_offset, remaining,
                                         BinaryRegionType::Unknown, remaining,
                                         0, field_comment));
      continue;
    }

    VTable::Entry entry;
    entry.field = nullptr;  // No field to reference.
    entry.offset_from_table = offset_from_table.value();
    fields.insert(std::make_pair(id, entry));

    regions.push_back(MakeBinaryRegion(field_offset, sizeof(uint16_t),
                                       BinaryRegionType::VOffset, 0, 0,
                                       field_comment));
  }

  // If we have never added this vtable before record the Binary section.
  if (vtables.empty()) {
    sections_[vtable_offset] = MakeBinarySection(
        referring_table_name, BinarySectionType::VTable, std::move(regions));
  } else {
    // Add the current table name to the name of the section.
    sections_[vtable_offset].name += ", " + referring_table_name;
  }

  VTable vtable;
  vtable.referring_table = table;
  vtable.fields = std::move(fields);
  vtable.table_size = table_size;
  vtable.vtable_size = vtable_size;

  // Add this vtable to the collection of vtables at this offset.
  vtables.push_back(std::move(vtable));

  // Return the vtable we just added.
  return &vtables.back();
}